

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O3

void gdImageFill(gdImagePtr im,int x,int y,int nc)

{
  int iVar1;
  uint b;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int *ptr;
  int *piVar12;
  long lVar13;
  long lVar14;
  int *piVar15;
  int y_00;
  uint uVar16;
  uint x_00;
  uint uVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  char *pcVar22;
  int *local_98;
  
  if ((im->trueColor == 0) && (im->colorsTotal <= nc)) {
    return;
  }
  iVar1 = im->alphaBlendingFlag;
  im->alphaBlendingFlag = 0;
  if (nc == -5) {
    if (im->tile == (gdImageStruct *)0x0) goto LAB_0010ef76;
    iVar10 = im->sx;
    iVar9 = im->sy;
    iVar4 = overflow2(iVar9,iVar10);
    if (iVar4 != 0) goto LAB_0010ef76;
    iVar5 = im->sx * im->sy;
    iVar4 = iVar5 + 3;
    if (-1 < iVar5) {
      iVar4 = iVar5;
    }
    iVar4 = overflow2(0x10,iVar4 >> 2);
    if ((iVar4 != 0) || (ptr = (int *)gdCalloc((long)im->sx * (long)im->sy,1), ptr == (int *)0x0))
    goto LAB_0010ef76;
    iVar5 = im->sx * im->sy;
    iVar4 = iVar5 + 3;
    if (-1 < iVar5) {
      iVar4 = iVar5;
    }
    piVar12 = (int *)gdMalloc((long)(iVar4 >> 2) << 4);
    if (piVar12 != (int *)0x0) {
      lVar18 = (long)iVar9;
      iVar4 = gdImageGetPixel(im,x,y);
      iVar5 = im->sx * im->sy;
      local_98 = piVar12;
      if ((y + 1 < iVar9 && -2 < y) && 3 < iVar5) {
        *piVar12 = y;
        piVar12[1] = x;
        piVar12[2] = x;
        piVar12[3] = 1;
        local_98 = piVar12 + 4;
      }
      iVar21 = iVar5 + 3;
      if (-1 < iVar5) {
        iVar21 = iVar5;
      }
      if ((local_98 < piVar12 + (long)(iVar21 >> 2) * 4) && (y < iVar9 && -1 < y)) {
        *local_98 = y + 1;
        local_98[1] = x;
        local_98[2] = x;
        local_98[3] = -1;
        local_98 = local_98 + 4;
      }
      if (piVar12 < local_98) {
LAB_0010e8bf:
        piVar15 = local_98 + -4;
        iVar5 = local_98[-4];
        iVar21 = local_98[-1];
        y_00 = iVar21 + iVar5;
        iVar8 = local_98[-3];
        lVar14 = (long)iVar8;
        iVar11 = local_98[-2];
        lVar13 = (long)y_00;
        iVar6 = iVar8;
        if (lVar14 < 0) goto LAB_0010eafb;
        pcVar22 = (char *)(lVar18 * lVar14 + lVar13 + (long)ptr);
        do {
          if (*pcVar22 != '\0') goto LAB_0010e963;
          iVar20 = (int)lVar14;
          iVar6 = gdImageGetPixel(im,iVar20,y_00);
          if (iVar6 != iVar4) goto LAB_0010e963;
          iVar6 = gdImageTileGet(im,iVar20,y_00);
          *pcVar22 = '\x01';
          gdImageSetPixel(im,iVar20,y_00,iVar6);
          pcVar22 = pcVar22 + -lVar18;
          bVar3 = 0 < lVar14;
          lVar14 = lVar14 + -1;
        } while (bVar3);
        lVar14 = 0xffffffff;
LAB_0010e963:
        iVar6 = (int)lVar14;
        if (iVar8 <= iVar6) goto LAB_0010eafb;
        iVar20 = iVar6 + 1;
        if (iVar20 < iVar8) {
          iVar7 = im->sx * im->sy;
          iVar6 = iVar7 + 3;
          if (-1 < iVar7) {
            iVar6 = iVar7;
          }
          if ((piVar15 < piVar12 + (long)(iVar6 >> 2) * 4) && (iVar5 < iVar9 && -1 < iVar5)) {
            local_98[-4] = y_00;
            local_98[-3] = iVar20;
            local_98[-2] = iVar8 + -1;
            local_98[-1] = -iVar21;
            piVar15 = local_98;
          }
        }
        iVar6 = iVar8 + 1;
        local_98 = piVar15;
        do {
          if (iVar6 < iVar10) {
            lVar14 = (long)iVar6;
            lVar19 = iVar10 - lVar14;
            pcVar22 = (char *)(lVar18 * lVar14 + lVar13 + (long)ptr);
            do {
              iVar6 = (int)lVar14;
              if ((*pcVar22 != '\0') || (iVar8 = gdImageGetPixel(im,iVar6,y_00), iVar8 != iVar4))
              break;
              iVar8 = gdImageTileGet(im,iVar6,y_00);
              *pcVar22 = '\x01';
              gdImageSetPixel(im,iVar6,y_00,iVar8);
              lVar14 = lVar14 + 1;
              pcVar22 = pcVar22 + lVar18;
              lVar19 = lVar19 + -1;
              iVar6 = iVar10;
            } while (lVar19 != 0);
          }
          iVar7 = im->sx * im->sy;
          iVar8 = iVar7 + 3;
          if (-1 < iVar7) {
            iVar8 = iVar7;
          }
          if ((local_98 < piVar12 + (long)(iVar8 >> 2) * 4) &&
             (y_00 + iVar21 < iVar9 && -1 < y_00 + iVar21)) {
            *local_98 = y_00;
            local_98[1] = iVar20;
            local_98[2] = iVar6 + -1;
            local_98[3] = iVar21;
            local_98 = local_98 + 4;
          }
          piVar15 = local_98;
          if (((iVar11 + 1 < iVar6) && (local_98 < piVar12 + (long)(iVar8 >> 2) * 4)) &&
             (iVar5 < iVar9 && -1 < iVar5)) {
            *local_98 = y_00;
            local_98[1] = iVar11 + 1;
            local_98[2] = iVar6 + -1;
            local_98[3] = -iVar21;
            piVar15 = local_98 + 4;
          }
LAB_0010eafb:
          local_98 = piVar15;
          if (iVar11 <= iVar6) goto LAB_0010eb51;
          lVar14 = (long)iVar11 - (long)iVar6;
          pcVar22 = (char *)((long)ptr + ((long)iVar6 + 1) * lVar18 + lVar13);
          iVar20 = iVar6;
          while ((iVar20 = iVar20 + 1, *pcVar22 != '\0' ||
                 (iVar8 = gdImageGetPixel(im,iVar20,y_00), iVar6 = iVar20, iVar8 != iVar4))) {
            pcVar22 = pcVar22 + lVar18;
            lVar14 = lVar14 + -1;
            if (lVar14 == 0) goto LAB_0010eb51;
          }
        } while( true );
      }
LAB_0010ef5d:
      gdFree(ptr);
      ptr = piVar12;
    }
  }
  else {
    b = im->sx;
    iVar10 = im->sy;
    iVar9 = gdImageGetPixel(im,x,y);
    if ((x < 0 || iVar9 == nc) || (iVar10 < y || (y < 0 || (int)b < x))) goto LAB_0010ef76;
    iVar4 = x;
    if (b < 4) {
      do {
        iVar10 = gdImageGetPixel(im,iVar4,y);
        if (iVar10 != iVar9) break;
        gdImageSetPixel(im,iVar4,y,nc);
        bVar3 = iVar4 < im->sx + -1;
        iVar4 = iVar4 + 1;
      } while ((bVar3) || (bVar3 = y < im->sy + -1, iVar4 = x, y = y + 1, bVar3));
      goto LAB_0010ef76;
    }
    iVar4 = overflow2(iVar10,b);
    if (iVar4 != 0) {
      return;
    }
    iVar5 = im->sx * im->sy;
    iVar4 = iVar5 + 3;
    if (-1 < iVar5) {
      iVar4 = iVar5;
    }
    iVar4 = overflow2(0x10,iVar4 >> 2);
    if (iVar4 != 0) {
      return;
    }
    iVar5 = im->sx * im->sy;
    iVar4 = iVar5 + 3;
    if (-1 < iVar5) {
      iVar4 = iVar5;
    }
    ptr = (int *)gdMalloc((long)(iVar4 >> 2) << 4);
    if (ptr == (int *)0x0) {
      return;
    }
    iVar4 = im->sx * im->sy;
    piVar12 = ptr;
    if (y + 1 < iVar10 && 3 < iVar4) {
      *ptr = y;
      ptr[1] = x;
      ptr[2] = x;
      ptr[3] = 1;
      piVar12 = ptr + 4;
    }
    iVar5 = iVar4 + 3;
    if (-1 < iVar4) {
      iVar5 = iVar4;
    }
    if (y < iVar10 && piVar12 < ptr + (long)(iVar5 >> 2) * 4) {
      *piVar12 = y + 1;
      piVar12[1] = x;
      piVar12[2] = x;
      piVar12[3] = -1;
      piVar12 = piVar12 + 4;
    }
    if (ptr < piVar12) {
LAB_0010ed2d:
      piVar15 = piVar12 + -4;
      iVar4 = piVar12[-4];
      uVar17 = piVar12[-3];
      iVar5 = piVar12[-1];
      iVar21 = iVar5 + iVar4;
      uVar2 = piVar12[-2];
      x_00 = uVar17;
      if ((int)uVar17 < 0) goto LAB_0010ef08;
      do {
        iVar8 = gdImageGetPixel(im,x_00,iVar21);
        if (iVar8 != iVar9) goto LAB_0010eda2;
        gdImageSetPixel(im,x_00,iVar21,nc);
        bVar3 = 0 < (int)x_00;
        x_00 = x_00 - 1;
      } while (bVar3);
      x_00 = 0xffffffff;
LAB_0010eda2:
      if ((int)uVar17 <= (int)x_00) goto LAB_0010ef08;
      uVar16 = x_00 + 1;
      if (uVar16 < uVar17) {
        iVar11 = im->sx * im->sy;
        iVar8 = iVar11 + 3;
        if (-1 < iVar11) {
          iVar8 = iVar11;
        }
        if ((piVar15 < ptr + (long)(iVar8 >> 2) * 4) && (iVar4 < iVar10 && -1 < iVar4)) {
          piVar12[-4] = iVar21;
          piVar12[-3] = uVar16;
          piVar12[-2] = uVar17 - 1;
          piVar12[-1] = -iVar5;
          piVar15 = piVar12;
        }
      }
      x_00 = uVar17 + 1;
      do {
        uVar17 = x_00;
        if ((int)x_00 <= (int)b) {
          do {
            iVar8 = gdImageGetPixel(im,x_00,iVar21);
            uVar17 = x_00;
            if (iVar8 != iVar9) break;
            gdImageSetPixel(im,x_00,iVar21,nc);
            x_00 = x_00 + 1;
            uVar17 = b + 1;
          } while (b + 1 != x_00);
        }
        iVar11 = im->sx * im->sy;
        iVar8 = iVar11 + 3;
        if (-1 < iVar11) {
          iVar8 = iVar11;
        }
        if ((piVar15 < ptr + (long)(iVar8 >> 2) * 4) &&
           (iVar21 + iVar5 < iVar10 && -1 < iVar21 + iVar5)) {
          *piVar15 = iVar21;
          piVar15[1] = uVar16;
          piVar15[2] = uVar17 - 1;
          piVar15[3] = iVar5;
          piVar15 = piVar15 + 4;
        }
        x_00 = uVar17;
        if ((((int)(uVar2 + 1) < (int)uVar17) && (piVar15 < ptr + (long)(iVar8 >> 2) * 4)) &&
           (iVar4 < iVar10 && -1 < iVar4)) {
          *piVar15 = iVar21;
          piVar15[1] = uVar2 + 1;
          piVar15[2] = uVar17 - 1;
          piVar15[3] = -iVar5;
          piVar15 = piVar15 + 4;
        }
LAB_0010ef08:
        uVar17 = uVar2;
        if ((int)uVar2 < (int)x_00) {
          uVar17 = x_00;
        }
        do {
          if (uVar17 == x_00) {
            piVar12 = piVar15;
            if (piVar15 <= ptr) goto LAB_0010ef6e;
            goto LAB_0010ed2d;
          }
          x_00 = x_00 + 1;
          iVar8 = gdImageGetPixel(im,x_00,iVar21);
          uVar16 = x_00;
        } while (iVar8 != iVar9);
      } while( true );
    }
  }
LAB_0010ef6e:
  gdFree(ptr);
LAB_0010ef76:
  im->alphaBlendingFlag = iVar1;
  return;
LAB_0010eb51:
  if (local_98 <= piVar12) goto LAB_0010ef5d;
  goto LAB_0010e8bf;
}

Assistant:

BGD_DECLARE(void) gdImageFill(gdImagePtr im, int x, int y, int nc)
{
	int l, x1, x2, dy;
	int oc;   /* old pixel value */
	int wx2,wy2;

	int alphablending_bak;

	/* stack of filled segments */
	/* struct seg stack[FILL_MAX],*sp = stack; */
	struct seg *stack;
	struct seg *sp;

	if (!im->trueColor && nc > (im->colorsTotal - 1)) {
		return;
	}

	alphablending_bak = im->alphaBlendingFlag;
	im->alphaBlendingFlag = 0;

	if (nc==gdTiled) {
		_gdImageFillTiled(im,x,y,nc);
		im->alphaBlendingFlag = alphablending_bak;
		return;
	}

	wx2=im->sx;
	wy2=im->sy;
	oc = gdImageGetPixel(im, x, y);
	if (oc==nc || x<0 || x>wx2 || y<0 || y>wy2) {
		im->alphaBlendingFlag = alphablending_bak;
		return;
	}

	/* Do not use the 4 neighbors implementation with
	* small images
	*/
	if (im->sx < 4) {
		int ix = x, iy = y, c;
		do {
			do {
				c = gdImageGetPixel(im, ix, iy);
				if (c != oc) {
					goto done;
				}
				gdImageSetPixel(im, ix, iy, nc);
			} while(ix++ < (im->sx -1));
			ix = x;
		} while(iy++ < (im->sy -1));
		goto done;
	}

	if(overflow2(im->sy, im->sx)) {
		return;
	}

	if(overflow2(sizeof(struct seg), ((im->sy * im->sx) / 4))) {
		return;
	}

	stack = (struct seg *)gdMalloc(sizeof(struct seg) * ((int)(im->sy*im->sx)/4));
	if (!stack) {
		return;
	}
	sp = stack;

	/* required! */
	FILL_PUSH(y,x,x,1);
	/* seed segment (popped 1st) */
	FILL_PUSH(y+1, x, x, -1);
	while (sp>stack) {
		FILL_POP(y, x1, x2, dy);

		for (x=x1; x>=0 && gdImageGetPixel(im,x, y)==oc; x--) {
			gdImageSetPixel(im,x, y, nc);
		}
		if (x>=x1) {
			goto skip;
		}
		l = x+1;

		/* leak on left? */
		if (l<x1) {
			FILL_PUSH(y, l, x1-1, -dy);
		}
		x = x1+1;
		do {
			for (; x<=wx2 && gdImageGetPixel(im,x, y)==oc; x++) {
				gdImageSetPixel(im, x, y, nc);
			}
			FILL_PUSH(y, l, x-1, dy);
			/* leak on right? */
			if (x>x2+1) {
				FILL_PUSH(y, x2+1, x-1, -dy);
			}
skip:
			for (x++; x<=x2 && (gdImageGetPixel(im, x, y)!=oc); x++);

			l = x;
		} while (x<=x2);
	}

	gdFree(stack);

done:
	im->alphaBlendingFlag = alphablending_bak;
}